

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<void_(const_absl::lts_20250127::LogEntry_&)>::
ExplainMatchResultTo
          (TypedExpectation<void_(const_absl::lts_20250127::LogEntry_&)> *this,ArgumentTuple *args,
          ostream *os)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  char *pcVar6;
  ExpectationSet unsatisfied_prereqs;
  string sStack_1e8;
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  size_t local_1a0;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = ExpectationBase::is_retired(&this->super_ExpectationBase);
  if (bVar2) {
    os = std::operator<<(os,"         Expected: the expectation is active\n");
    pcVar6 = "           Actual: it is retired\n";
LAB_00cfe49f:
    std::operator<<(os,pcVar6);
    return;
  }
  bVar2 = Matches(this,args);
  if (bVar2) {
    bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar2) {
      pcVar6 = "The call matches the expectation.\n";
      goto LAB_00cfe49f;
    }
    poVar3 = std::operator<<(os,"         Expected: all pre-requisites are satisfied\n");
    poVar3 = std::operator<<(poVar3,"           Actual: the following immediate pre-requisites ");
    std::operator<<(poVar3,"are not satisfied:\n");
    p_Var1 = (_Rb_tree_node_base *)(local_1c8 + 8);
    local_1c8._8_4_ = _S_red;
    local_1b8 = (_Base_ptr)0x0;
    local_1a0 = 0;
    local_1b0 = p_Var1;
    local_1a8 = p_Var1;
    ExpectationBase::FindUnsatisfiedPrerequisites
              (&this->super_ExpectationBase,(ExpectationSet *)local_1c8);
    iVar5 = 0;
    p_Var4 = local_1b0;
    while (p_Var4 != p_Var1) {
      ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var4 + 1),os);
      poVar3 = std::operator<<(os,"pre-requisite #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      iVar5 = iVar5 + 1;
    }
    std::operator<<(os,"                   (end of pre-requisites)\n");
    std::
    _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
    ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                 *)local_1c8);
  }
  else {
    bVar2 = TuplePrefix<1ul>::
            Matches<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
                      (&this->matchers_,args);
    if (!bVar2) {
      TuplePrefix<1ul>::
      ExplainMatchFailuresTo<std::tuple<testing::Matcher<absl::lts_20250127::LogEntry_const&>>,std::tuple<absl::lts_20250127::LogEntry_const&>>
                (&this->matchers_,args,os);
    }
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c8);
    bVar2 = MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>::MatchAndExplain
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>,
                       args,(MatchResultListener *)local_1c8);
    if (!bVar2) {
      std::operator<<(os,"    Expected args: ");
      MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>::DescribeTo
                (&(this->extra_matcher_).
                  super_MatcherBase<const_std::tuple<const_absl::lts_20250127::LogEntry_&>_&>,os);
      std::operator<<(os,"\n           Actual: don\'t match");
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&sStack_1e8,os);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::operator<<(os,"\n");
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c8);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }